

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QXcbVirtualDesktop * __thiscall
QXcbConnection::virtualDesktopForRootWindow(QXcbConnection *this,xcb_window_t rootWindow)

{
  long lVar1;
  
  if (*(long *)(this + 0x330) != 0) {
    lVar1 = 0;
    do {
      if ((*(QXcbVirtualDesktop **)(*(long *)(this + 0x328) + lVar1))->m_screen->root == rootWindow)
      {
        return *(QXcbVirtualDesktop **)(*(long *)(this + 0x328) + lVar1);
      }
      lVar1 = lVar1 + 8;
    } while (*(long *)(this + 0x330) << 3 != lVar1);
  }
  return (QXcbVirtualDesktop *)0x0;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }